

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::WeakCrossingSIVTest
          (LoopDependenceAnalysis *this,SENode *source,SENode *destination,SENode *coefficient,
          DistanceEntry *distance_entry)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SENode *pSVar6;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar7;
  long lVar8;
  _Alloc_hider _Var9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  float fVar11;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Performing WeakCrossingSIVTest.","");
  PrintDebug(this,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  iVar4 = (*source->_vptr_SENode[6])(source);
  if ((CONCAT44(extraout_var,iVar4) == 0) ||
     (iVar4 = (*destination->_vptr_SENode[6])(destination), CONCAT44(extraout_var_00,iVar4) == 0)) {
    paVar10 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,
               "WeakCrossingSIVTest found source or destination != SERecurrentNode. Exiting","");
    PrintDebug(this,&local_50);
    _Var9._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar10) goto LAB_005db231;
  }
  else {
    iVar4 = (*destination->_vptr_SENode[6])(destination);
    pSVar6 = *(SENode **)(CONCAT44(extraout_var_01,iVar4) + 0x38);
    iVar4 = (*source->_vptr_SENode[6])(source);
    pSVar6 = ScalarEvolutionAnalysis::CreateSubtraction
                       (&this->scalar_evolution_,pSVar6,
                        *(SENode **)(CONCAT44(extraout_var_02,iVar4) + 0x38));
    pSVar6 = ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar6);
    iVar4 = (*pSVar6->_vptr_SENode[4])(pSVar6);
    iVar5 = (*coefficient->_vptr_SENode[4])(coefficient);
    if (CONCAT44(extraout_var_04,iVar5) == 0 || CONCAT44(extraout_var_03,iVar4) == 0) {
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,
                 "WeakCrossingSIVTest was unable to fold offset_delta and coefficient to constants."
                 ,"");
      PrintDebug(this,&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,
                 "WeakCrossingSIVTest folding offset_delta and coefficient to constants.","");
      PrintDebug(this,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      lVar8 = *(long *)(CONCAT44(extraout_var_03,iVar4) + 0x30);
      lVar1 = *(long *)(CONCAT44(extraout_var_04,iVar5) + 0x30) * 2;
      lVar7 = lVar8 / lVar1;
      lVar8 = lVar8 % lVar1;
      if ((lVar8 == 0) || ((fVar11 = (float)lVar8 / (float)lVar1, fVar11 == 0.5 && (!NAN(fVar11)))))
      {
        if (lVar7 == 0) {
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f0,"WeakCrossingSIVTest found EQ dependence.","");
          PrintDebug(this,&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          distance_entry->dependence_information = DISTANCE;
          distance_entry->direction = EQ;
          distance_entry->distance = 0;
          lVar7 = 0;
          goto LAB_005db314;
        }
        bVar2 = true;
      }
      else {
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,
                   "WeakCrossingSIVTest proved independence through distance escaping the loop bounds."
                   ,"");
        PrintDebug(this,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        distance_entry->dependence_information = DIRECTION;
        distance_entry->direction = NONE;
        lVar7 = 1;
LAB_005db314:
        bVar2 = false;
      }
      bVar3 = (byte)lVar7;
      if (!bVar2) goto LAB_005db246;
    }
    paVar10 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "WeakCrossingSIVTest was unable to determine any dependence information.","");
    PrintDebug(this,&local_70);
    _Var9._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar10) {
LAB_005db231:
      operator_delete(_Var9._M_p,paVar10->_M_allocated_capacity + 1);
    }
  }
  distance_entry->direction = ALL;
  bVar3 = 0;
LAB_005db246:
  return (bool)(bVar3 & 1);
}

Assistant:

bool LoopDependenceAnalysis::WeakCrossingSIVTest(
    SENode* source, SENode* destination, SENode* coefficient,
    DistanceEntry* distance_entry) {
  PrintDebug("Performing WeakCrossingSIVTest.");
  // We currently can't handle symbolic WeakCrossingSIVTests. If either source
  // or destination are not SERecurrentNodes we must exit.
  if (!source->AsSERecurrentNode() || !destination->AsSERecurrentNode()) {
    PrintDebug(
        "WeakCrossingSIVTest found source or destination != SERecurrentNode. "
        "Exiting");
    distance_entry->direction = DistanceEntry::Directions::ALL;
    return false;
  }

  // Build an SENode for distance.
  SENode* offset_delta =
      scalar_evolution_.SimplifyExpression(scalar_evolution_.CreateSubtraction(
          destination->AsSERecurrentNode()->GetOffset(),
          source->AsSERecurrentNode()->GetOffset()));

  // Scalar evolution doesn't perform division, so we must fold to constants and
  // do it manually.
  int64_t distance = 0;
  SEConstantNode* delta_constant = offset_delta->AsSEConstantNode();
  SEConstantNode* coefficient_constant = coefficient->AsSEConstantNode();
  if (delta_constant && coefficient_constant) {
    PrintDebug(
        "WeakCrossingSIVTest folding offset_delta and coefficient to "
        "constants.");
    int64_t delta_value = delta_constant->FoldToSingleValue();
    int64_t coefficient_value = coefficient_constant->FoldToSingleValue();
    // Check if the distance is not integral or if it has a non-integral part
    // equal to 1/2.
    if (delta_value % (2 * coefficient_value) != 0 &&
        static_cast<float>(delta_value % (2 * coefficient_value)) /
                static_cast<float>(2 * coefficient_value) !=
            0.5) {
      PrintDebug(
          "WeakCrossingSIVTest proved independence through distance escaping "
          "the loop bounds.");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::DIRECTION;
      distance_entry->direction = DistanceEntry::Directions::NONE;
      return true;
    } else {
      distance = delta_value / (2 * coefficient_value);
    }

    if (distance == 0) {
      PrintDebug("WeakCrossingSIVTest found EQ dependence.");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::DISTANCE;
      distance_entry->direction = DistanceEntry::Directions::EQ;
      distance_entry->distance = 0;
      return false;
    }
  } else {
    PrintDebug(
        "WeakCrossingSIVTest was unable to fold offset_delta and coefficient "
        "to constants.");
  }

  // We were unable to prove independence or discern any additional information.
  // Must assume <=> direction.
  PrintDebug(
      "WeakCrossingSIVTest was unable to determine any dependence "
      "information.");
  distance_entry->direction = DistanceEntry::Directions::ALL;
  return false;
}